

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_zeropage_indexed_instructions.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_217e71::CpuZeropageIndexedTest_sbc_zero_x_Test::
CpuZeropageIndexedTest_sbc_zero_x_Test(CpuZeropageIndexedTest_sbc_zero_x_Test *this)

{
  CpuZeropageIndexedTest_sbc_zero_x_Test *this_local;
  
  CpuZeropageIndexedTest::CpuZeropageIndexedTest(&this->super_CpuZeropageIndexedTest);
  (this->super_CpuZeropageIndexedTest).super_CpuTest.super_Test._vptr_Test =
       (_func_int **)&PTR__CpuZeropageIndexedTest_sbc_zero_x_Test_003f42a0;
  return;
}

Assistant:

TEST_F(CpuZeropageIndexedTest, sbc_zero_x) {
    registers.a = 0x50;
    registers.p = V_FLAG | C_FLAG;
    expected.p = C_FLAG;
    expected.a = 0x50 - 0x07;
    memory_content = 0x07;

    run_read_instruction(SBC_ZEROX, IndexReg::X);
}